

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle_p.h
# Opt level: O1

bool __thiscall
QCommonStylePrivate::isViewItemCached(QCommonStylePrivate *this,QStyleOptionViewItem *option)

{
  QStyleOptionViewItem *pQVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  QStringView QVar9;
  QStringView QVar10;
  
  pQVar1 = this->cachedOption;
  if (((((pQVar1 != (QStyleOptionViewItem *)0x0) && (option->widget == pQVar1->widget)) &&
       ((option->index).r == (pQVar1->index).r)) &&
      (((option->index).c == (pQVar1->index).c && ((option->index).i == (pQVar1->index).i)))) &&
     (((((option->index).m.ptr == (pQVar1->index).m.ptr &&
        (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i ==
          (pQVar1->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i &&
         ((option->super_QStyleOption).rect.x1.m_i == (pQVar1->super_QStyleOption).rect.x1.m_i))))
       && ((option->super_QStyleOption).rect.x2.m_i == (pQVar1->super_QStyleOption).rect.x2.m_i)) &&
      (((option->super_QStyleOption).rect.y1.m_i == (pQVar1->super_QStyleOption).rect.y1.m_i &&
       ((option->super_QStyleOption).rect.y2.m_i == (pQVar1->super_QStyleOption).rect.y2.m_i)))))) {
    lVar2 = (option->text).d.size;
    lVar3 = (pQVar1->text).d.size;
    if (((lVar2 == lVar3) &&
        (((QVar9.m_data = (option->text).d.ptr, QVar9.m_size = lVar2,
          QVar10.m_data = (pQVar1->text).d.ptr, QVar10.m_size = lVar3,
          cVar4 = QtPrivate::equalStrings(QVar9,QVar10), cVar4 != '\0' &&
          ((option->super_QStyleOption).direction == (pQVar1->super_QStyleOption).direction)) &&
         ((option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
          super_QFlagsStorage<Qt::AlignmentFlag>.i ==
          (pQVar1->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
          super_QFlagsStorage<Qt::AlignmentFlag>.i)))) &&
       (((((option->decorationAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
           super_QFlagsStorage<Qt::AlignmentFlag>.i ==
           (pQVar1->decorationAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
           super_QFlagsStorage<Qt::AlignmentFlag>.i &&
          (option->decorationPosition == pQVar1->decorationPosition)) &&
         (iVar7 = -(uint)((pQVar1->decorationSize).wd.m_i == (option->decorationSize).wd.m_i),
         iVar8 = -(uint)((pQVar1->decorationSize).ht.m_i == (option->decorationSize).ht.m_i),
         auVar6._4_4_ = iVar7, auVar6._0_4_ = iVar7, auVar6._8_4_ = iVar8, auVar6._12_4_ = iVar8,
         iVar7 = movmskpd(option->decorationPosition,auVar6), iVar7 == 3)) &&
        ((option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
         super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i ==
         (pQVar1->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
         super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i)))) {
      cVar4 = QIcon::isNull();
      cVar5 = QIcon::isNull();
      if (((cVar4 == cVar5) &&
          (cVar4 = QFont::operator==(&option->font,&this->cachedOption->font), cVar4 != '\0')) &&
         (option->viewItemPosition == this->cachedOption->viewItemPosition)) {
        return option->showDecorationSelected == this->cachedOption->showDecorationSelected;
      }
    }
  }
  return false;
}

Assistant:

bool isViewItemCached(const QStyleOptionViewItem &option) const {
        return cachedOption && (option.widget == cachedOption->widget
               && option.index == cachedOption->index
               && option.state == cachedOption->state
               && option.rect == cachedOption->rect
               && option.text == cachedOption->text
               && option.direction == cachedOption->direction
               && option.displayAlignment == cachedOption->displayAlignment
               && option.decorationAlignment == cachedOption->decorationAlignment
               && option.decorationPosition == cachedOption->decorationPosition
               && option.decorationSize == cachedOption->decorationSize
               && option.features == cachedOption->features
               && option.icon.isNull() == cachedOption->icon.isNull()
               && option.font == cachedOption->font
               && option.viewItemPosition == cachedOption->viewItemPosition
               && option.showDecorationSelected == cachedOption->showDecorationSelected);
    }